

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneComponentMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrSceneComponentTypeMSFT XVar3;
  pointer pcVar4;
  XrSceneComponentTypeMSFT __val;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *contents_00;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  invalid_argument *piVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  XrGeneratedDispatchTable *pXVar13;
  uint uVar14;
  ulong __val_00;
  string id_prefix;
  string componenttype_prefix;
  string parentid_prefix;
  string updatetime_prefix;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_118;
  long *local_110;
  long local_108;
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  paVar1 = &local_138.field_2;
  local_158._M_dataplus._M_p = (pointer)value;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x12');
  *local_138._M_dataplus._M_p = '0';
  local_138._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_138._M_dataplus._M_p + (local_138._M_string_length - 1);
  lVar10 = 0;
  do {
    bVar2 = *(byte *)((long)&local_158._M_dataplus._M_p + lVar10);
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar10 = lVar10 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar10 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_138);
  XVar3 = value->componentType;
  __val = -XVar3;
  if (~XR_SCENE_COMPONENT_TYPE_INVALID_MSFT < XVar3) {
    __val = XVar3;
  }
  uVar14 = 1;
  if (9 < (uint)__val) {
    uVar12 = (ulong)(uint)__val;
    uVar5 = 4;
    do {
      uVar14 = uVar5;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00185389;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00185389;
      }
      if (uVar9 < 10000) goto LAB_00185389;
      uVar12 = uVar12 / 10000;
      uVar5 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_00185389:
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_118 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar14 - (char)(XVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_158._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),uVar14,__val);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
            (local_118,(char (*) [25])"XrSceneComponentTypeMSFT",&local_138,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_158);
  contents_00 = local_118;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_158._M_dataplus._M_p,
             local_158._M_dataplus._M_p + local_158._M_string_length);
  pXVar13 = (XrGeneratedDispatchTable *)local_70;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"XrUuidMSFT","");
  bVar6 = ApiDumpOutputXrStruct
                    (pXVar13,&value->id,&local_50,(string *)local_70,false,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)contents_00);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_60._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_110 = local_100;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_110,local_108 + (long)local_110);
  pXVar13 = (XrGeneratedDispatchTable *)local_b0;
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"XrUuidMSFT","");
  bVar6 = ApiDumpOutputXrStruct
                    (pXVar13,&value->parentId,&local_90,(string *)local_b0,false,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)contents_00);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  uVar12 = value->updateTime;
  __val_00 = -uVar12;
  if (0 < (long)uVar12) {
    __val_00 = uVar12;
  }
  uVar14 = 1;
  if (9 < __val_00) {
    uVar11 = __val_00;
    uVar5 = 4;
    do {
      uVar14 = uVar5;
      if (uVar11 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00185649;
      }
      if (uVar11 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00185649;
      }
      if (uVar11 < 10000) goto LAB_00185649;
      bVar6 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar5 = uVar14 + 4;
    } while (bVar6);
    uVar14 = uVar14 + 1;
  }
LAB_00185649:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar14 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_d0._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar14,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            (local_118,(char (*) [7])"XrTime",&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneComponentMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string componenttype_prefix = prefix;
        componenttype_prefix += "componentType";
        contents.emplace_back("XrSceneComponentTypeMSFT", componenttype_prefix, std::to_string(value->componentType));
        std::string id_prefix = prefix;
        id_prefix += "id";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->id, id_prefix, "XrUuidMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string parentid_prefix = prefix;
        parentid_prefix += "parentId";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->parentId, parentid_prefix, "XrUuidMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string updatetime_prefix = prefix;
        updatetime_prefix += "updateTime";
        contents.emplace_back("XrTime", updatetime_prefix, std::to_string(value->updateTime));
        return true;
    } catch(...) {
    }
    return false;
}